

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O2

void __thiscall enact::StringExpr::~StringExpr(StringExpr *this)

{
  ~StringExpr(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~StringExpr() override = default;